

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O2

Interval *
tcu::anon_unknown_4::chooseInterval
          (Interval *__return_storage_ptr__,YesNoMaybe choice,Interval *no,Interval *yes)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  if (choice == YES) {
    __return_storage_ptr__->m_hi = yes->m_hi;
    uVar1 = *(undefined4 *)yes;
    uVar2 = *(undefined4 *)&yes->field_0x4;
    uVar3 = *(undefined4 *)&yes->m_lo;
    uVar4 = *(undefined4 *)((long)&yes->m_lo + 4);
  }
  else {
    if (choice == MAYBE) {
      Interval::operator|(no,yes);
      return __return_storage_ptr__;
    }
    if (choice != NO) {
      __return_storage_ptr__->m_hasNaN = false;
      __return_storage_ptr__->m_lo = INFINITY;
      __return_storage_ptr__->m_hi = -INFINITY;
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->m_hi = no->m_hi;
    uVar1 = *(undefined4 *)no;
    uVar2 = *(undefined4 *)&no->field_0x4;
    uVar3 = *(undefined4 *)&no->m_lo;
    uVar4 = *(undefined4 *)((long)&no->m_lo + 4);
  }
  *(undefined4 *)__return_storage_ptr__ = uVar1;
  *(undefined4 *)&__return_storage_ptr__->field_0x4 = uVar2;
  *(undefined4 *)&__return_storage_ptr__->m_lo = uVar3;
  *(undefined4 *)((long)&__return_storage_ptr__->m_lo + 4) = uVar4;
  return __return_storage_ptr__;
}

Assistant:

Interval chooseInterval(YesNoMaybe choice, const Interval& no, const Interval& yes)
{
	switch (choice)
	{
		case NO:	return no;
		case YES:	return yes;
		case MAYBE:	return no | yes;
		default:	DE_FATAL("Impossible case");
	}

	return Interval();
}